

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

void Sparc_printInst(MCInst *MI,SStream *O,void *Info)

{
  _Bool _Var1;
  sparc_reg Op;
  uint uVar2;
  sparc_cc sVar3;
  sparc_hint sVar4;
  char *__s;
  size_t sVar5;
  char *pcVar6;
  char local_78 [5];
  char acStack_73 [3];
  char instr [64];
  char *p;
  char *mnem;
  void *Info_local;
  SStream *O_local;
  MCInst *MI_local;
  
  __s = printAliasInstr(MI,O,Info);
  if (__s == (char *)0x0) {
    _Var1 = printSparcAliasInstr(MI,O);
    if (_Var1) {
      return;
    }
    printInstruction(MI,O,(MCRegisterInfo *)0x0);
    return;
  }
  sVar5 = strlen(__s);
  strncpy(local_78,__s,sVar5);
  sVar5 = strlen(__s);
  local_78[sVar5] = '\0';
  pcVar6 = strchr(local_78,0x2c);
  if (pcVar6 != (char *)0x0) {
    *pcVar6 = '\0';
  }
  Op = Sparc_map_insn(local_78);
  MCInst_setOpcodePub(MI,Op);
  uVar2 = MCInst_getOpcode(MI);
  if (1 < uVar2 - 0x48) {
    if (uVar2 - 0x4f < 2) {
      if (MI->csh->detail != CS_OPT_OFF) {
        sVar3 = Sparc_map_FCC(local_78 + 2);
        (MI->flat_insn->detail->field_6).sparc.cc = sVar3;
        sVar4 = Sparc_map_hint(__s);
        (MI->flat_insn->detail->field_6).sparc.hint = sVar4;
      }
      goto LAB_0020d244;
    }
    if ((1 < uVar2 - 0x5b) && (1 < uVar2 - 0x6b)) {
      if ((uVar2 - 0xb9 < 2) || ((uVar2 - 0xbd < 2 || (uVar2 - 0xd3 < 2)))) {
        if (MI->csh->detail != CS_OPT_OFF) {
          sVar3 = Sparc_map_ICC(acStack_73);
          (MI->flat_insn->detail->field_6).sparc.cc = sVar3;
          sVar4 = Sparc_map_hint(__s);
          (MI->flat_insn->detail->field_6).sparc.hint = sVar4;
        }
        goto LAB_0020d244;
      }
      if ((uVar2 - 0x148 < 2) || (uVar2 - 0x159 < 2)) {
        if (MI->csh->detail != CS_OPT_OFF) {
          sVar3 = Sparc_map_ICC(local_78 + 3);
          (MI->flat_insn->detail->field_6).sparc.cc = sVar3;
          sVar4 = Sparc_map_hint(__s);
          (MI->flat_insn->detail->field_6).sparc.hint = sVar4;
        }
        goto LAB_0020d244;
      }
      if (1 < uVar2 - 0x1c4) {
        if (uVar2 - 0x1d8 < 3) {
          if (MI->csh->detail != CS_OPT_OFF) {
            sVar3 = Sparc_map_FCC(acStack_73);
            (MI->flat_insn->detail->field_6).sparc.cc = sVar3;
            sVar4 = Sparc_map_hint(__s);
            (MI->flat_insn->detail->field_6).sparc.hint = sVar4;
          }
        }
        else if ((uVar2 - 0x1db < 2) && (MI->csh->detail != CS_OPT_OFF)) {
          sVar3 = Sparc_map_FCC(local_78 + 3);
          (MI->flat_insn->detail->field_6).sparc.cc = sVar3;
          sVar4 = Sparc_map_hint(__s);
          (MI->flat_insn->detail->field_6).sparc.hint = sVar4;
        }
        goto LAB_0020d244;
      }
    }
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    sVar3 = Sparc_map_ICC(local_78 + 1);
    (MI->flat_insn->detail->field_6).sparc.cc = sVar3;
    sVar4 = Sparc_map_hint(__s);
    (MI->flat_insn->detail->field_6).sparc.hint = sVar4;
  }
LAB_0020d244:
  (*cs_mem_free)(__s);
  return;
}

Assistant:

void Sparc_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem, *p;
	char instr[64];	// Sparc has no instruction this long

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		// fixup instruction id due to the change in alias instruction
		strncpy(instr, mnem, strlen(mnem));
		instr[strlen(mnem)] = '\0';
		// does this contains hint with a coma?
		p = strchr(instr, ',');
		if (p)
			*p = '\0';	// now instr only has instruction mnemonic
		MCInst_setOpcodePub(MI, Sparc_map_insn(instr));
		switch(MCInst_getOpcode(MI)) {
			case SP_BCOND:
			case SP_BCONDA:
			case SP_BPICCANT:
			case SP_BPICCNT:
			case SP_BPXCCANT:
			case SP_BPXCCNT:
			case SP_TXCCri:
			case SP_TXCCrr:
				if (MI->csh->detail) {
					// skip 'b', 't'
					MI->flat_insn->detail->sparc.cc = Sparc_map_ICC(instr + 1);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_BPFCCANT:
			case SP_BPFCCNT:
				if (MI->csh->detail) {
					// skip 'fb'
					MI->flat_insn->detail->sparc.cc = Sparc_map_FCC(instr + 2);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_FMOVD_ICC:
			case SP_FMOVD_XCC:
			case SP_FMOVQ_ICC:
			case SP_FMOVQ_XCC:
			case SP_FMOVS_ICC:
			case SP_FMOVS_XCC:
				if (MI->csh->detail) {
					// skip 'fmovd', 'fmovq', 'fmovs'
					MI->flat_insn->detail->sparc.cc = Sparc_map_ICC(instr + 5);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_MOVICCri:
			case SP_MOVICCrr:
			case SP_MOVXCCri:
			case SP_MOVXCCrr:
				if (MI->csh->detail) {
					// skip 'mov'
					MI->flat_insn->detail->sparc.cc = Sparc_map_ICC(instr + 3);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_V9FMOVD_FCC:
			case SP_V9FMOVQ_FCC:
			case SP_V9FMOVS_FCC:
				if (MI->csh->detail) {
					// skip 'fmovd', 'fmovq', 'fmovs'
					MI->flat_insn->detail->sparc.cc = Sparc_map_FCC(instr + 5);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_V9MOVFCCri:
			case SP_V9MOVFCCrr:
				if (MI->csh->detail) {
					// skip 'mov'
					MI->flat_insn->detail->sparc.cc = Sparc_map_FCC(instr + 3);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			default:
				break;
		}
		cs_mem_free(mnem);
	} else {
		if (!printSparcAliasInstr(MI, O))
			printInstruction(MI, O, NULL);
	}
}